

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  wchar_t *pwVar5;
  wchar_t *pwVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  
  uVar13 = this->num_digits_;
  uVar1 = this->exp_ + uVar13;
  uVar9 = (ulong)uVar1;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar3 = this->digits_;
    *it = (int)*pcVar3;
    iVar2 = (this->specs_).precision;
    iVar12 = iVar2 - uVar13;
    bVar11 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 &
             (iVar12 != 0 && (int)uVar13 <= iVar2);
    if (((int)uVar13 < 2) && (bVar11 == 0)) {
      pwVar6 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar6 = it + 2;
    }
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(pcVar3 + 1,pcVar3 + (int)uVar13,pwVar6);
    if (bVar11 != 0) {
      pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6,iVar12);
    }
    *pwVar6 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar6 = write_exponent<wchar_t,wchar_t*>(uVar1 - 1,pwVar6 + 1);
    return pwVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar1 < 1) {
      *it = L'0';
      iVar8 = -uVar1;
      iVar2 = (this->specs_).precision;
      iVar12 = iVar8;
      if (SBORROW4(iVar2,iVar8) != (int)(iVar2 + uVar1) < 0) {
        iVar12 = iVar2;
      }
      if (iVar2 < 0) {
        iVar12 = iVar8;
      }
      if (0 < (int)uVar13 && ((this->specs_).field_0x6 & 0x20) == 0) {
        do {
          if (this->digits_[(ulong)uVar13 - 1] != '0') goto LAB_00175389;
          bVar4 = 1 < (int)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar4);
        uVar13 = 0;
      }
      if (iVar12 == 0 && uVar13 == 0) {
        return it + 1;
      }
LAB_00175389:
      it[1] = this->decimal_point_;
      pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(it + 2);
      pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar13,pwVar6);
      return pwVar6;
    }
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + uVar9,it);
    if (((this->specs_).field_0x6 & 0x20) == 0) {
      uVar13 = this->num_digits_;
      lVar10 = (long)(int)uVar13;
      pcVar3 = this->digits_;
      uVar7 = uVar9;
      if ((int)uVar13 < (int)uVar1) {
        uVar7 = (ulong)uVar13;
      }
      do {
        uVar13 = (uint)uVar7;
        if (lVar10 <= (long)uVar9) {
LAB_00175402:
          if (uVar13 != uVar1) {
            *pwVar6 = this->decimal_point_;
            pwVar6 = pwVar6 + 1;
          }
          pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
                   __copy_m<char_const*,wchar_t*>(pcVar3 + uVar9,pcVar3 + (int)uVar13,pwVar6);
          return pwVar6;
        }
        if (pcVar3[lVar10 + -1] != '0') {
          uVar13 = (uint)lVar10;
          goto LAB_00175402;
        }
        lVar10 = lVar10 + -1;
      } while( true );
    }
    *pwVar6 = this->decimal_point_;
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>
                       (this->digits_ + uVar9,this->digits_ + this->num_digits_,pwVar6 + 1);
    if ((this->specs_).precision <= this->num_digits_) {
      return pwVar6;
    }
  }
  else {
    pwVar6 = std::__copy_move<false,false,std::random_access_iterator_tag>::
             __copy_m<char_const*,wchar_t*>(this->digits_,this->digits_ + (int)uVar13,it);
    pwVar5 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6,uVar1 - this->num_digits_);
    if (((this->specs_).field_0x6 & 0x20) == 0) {
      return pwVar5;
    }
    pwVar6 = pwVar5 + 1;
    *pwVar5 = this->decimal_point_;
    if ((this->specs_).precision <= (int)uVar1) {
      if ((this->specs_).field_0x4 == '\x02') {
        return pwVar6;
      }
      pwVar5[1] = L'0';
      return pwVar5 + 2;
    }
  }
  pwVar6 = std::__fill_n_a<wchar_t*,int,wchar_t>(pwVar6);
  return pwVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }